

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf)

{
  string depname;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&this->Name);
  std::__cxx11::string::append((char *)&local_30);
  cmMakefile::RemoveCacheDefinition(mf,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf)
{
  std::string depname = this->GetName();
  depname += "_LIB_DEPENDS";
  mf.RemoveCacheDefinition(depname);
}